

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.h
# Opt level: O2

void __thiscall HighsSparseMatrix::~HighsSparseMatrix(HighsSparseMatrix *this)

{
  CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)(this + 0x58));
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(this + 0x40));
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(this + 0x28));
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(this + 0x10));
  return;
}

Assistant:

HighsSparseMatrix() { clear(); }